

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_scanner.cpp
# Opt level: O3

void __thiscall
duckdb::BaseScanner::BaseScanner
          (BaseScanner *this,shared_ptr<duckdb::CSVBufferManager,_true> *buffer_manager_p,
          shared_ptr<duckdb::CSVStateMachine,_true> *state_machine_p,
          shared_ptr<duckdb::CSVErrorHandler,_true> *error_handler_p,bool sniffing_p,
          shared_ptr<duckdb::CSVFileScan,_true> *csv_file_scan_p,CSVIterator *iterator_p)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  element_type *peVar2;
  element_type *peVar3;
  element_type *peVar4;
  element_type *peVar5;
  ClientContext *pCVar6;
  CSVBufferHandle *__tmp;
  CSVBufferManager *pos;
  __uniq_ptr_impl<duckdb::CSVFileHandle,_std::default_delete<duckdb::CSVFileHandle>_> _Var7;
  CSVBufferHandle *pCVar8;
  data_ptr_t pdVar9;
  long lVar10;
  CSVIterator *pCVar11;
  optional_ptr<duckdb::FileBuffer,_true> *this_00;
  _Head_base<0UL,_duckdb::CSVFileHandle_*,_false> local_28;
  ClientContext *pCStack_20;
  
  this->_vptr_BaseScanner = (_func_int **)&PTR__BaseScanner_0246be70;
  (this->csv_file_scan).internal.super___shared_ptr<duckdb::CSVFileScan,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  peVar2 = (csv_file_scan_p->internal).
           super___shared_ptr<duckdb::CSVFileScan,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var1 = (csv_file_scan_p->internal).
           super___shared_ptr<duckdb::CSVFileScan,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (csv_file_scan_p->internal).super___shared_ptr<duckdb::CSVFileScan,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->csv_file_scan).internal.super___shared_ptr<duckdb::CSVFileScan,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = peVar2;
  (this->csv_file_scan).internal.super___shared_ptr<duckdb::CSVFileScan,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = p_Var1;
  (csv_file_scan_p->internal).super___shared_ptr<duckdb::CSVFileScan,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  this->sniffing = sniffing_p;
  (this->error_handler).internal.
  super___shared_ptr<duckdb::CSVErrorHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  peVar3 = (error_handler_p->internal).
           super___shared_ptr<duckdb::CSVErrorHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var1 = (error_handler_p->internal).
           super___shared_ptr<duckdb::CSVErrorHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
  ;
  (error_handler_p->internal).
  super___shared_ptr<duckdb::CSVErrorHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->error_handler).internal.
  super___shared_ptr<duckdb::CSVErrorHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar3;
  (this->error_handler).internal.
  super___shared_ptr<duckdb::CSVErrorHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = p_Var1
  ;
  (error_handler_p->internal).
  super___shared_ptr<duckdb::CSVErrorHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->state_machine).internal.
  super___shared_ptr<duckdb::CSVStateMachine,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  peVar4 = (state_machine_p->internal).
           super___shared_ptr<duckdb::CSVStateMachine,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var1 = (state_machine_p->internal).
           super___shared_ptr<duckdb::CSVStateMachine,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
  ;
  (state_machine_p->internal).
  super___shared_ptr<duckdb::CSVStateMachine,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->state_machine).internal.
  super___shared_ptr<duckdb::CSVStateMachine,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar4;
  (this->state_machine).internal.
  super___shared_ptr<duckdb::CSVStateMachine,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = p_Var1
  ;
  (state_machine_p->internal).
  super___shared_ptr<duckdb::CSVStateMachine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  this->states = (CSVState  [2])0x0;
  this->ever_quoted = false;
  this->ever_escaped = false;
  (this->buffer_manager).internal.
  super___shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  peVar5 = (buffer_manager_p->internal).
           super___shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var1 = (buffer_manager_p->internal).
           super___shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  (buffer_manager_p->internal).
  super___shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->buffer_manager).internal.
  super___shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar5;
  (this->buffer_manager).internal.
  super___shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Var1;
  (buffer_manager_p->internal).
  super___shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  pCVar11 = &this->iterator;
  for (lVar10 = 9; lVar10 != 0; lVar10 = lVar10 + -1) {
    (pCVar11->pos).buffer_idx = (iterator_p->pos).buffer_idx;
    iterator_p = (CSVIterator *)&(iterator_p->pos).buffer_pos;
    pCVar11 = (CSVIterator *)&(pCVar11->pos).buffer_pos;
  }
  *(undefined8 *)
   ((long)&(this->cur_buffer_handle).internal.
           super___shared_ptr<duckdb::CSVBufferHandle,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
   + 1) = 0;
  *(undefined8 *)((long)&this->buffer_handle_ptr + 1) = 0;
  (this->cur_buffer_handle).internal.
  super___shared_ptr<duckdb::CSVBufferHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->cur_buffer_handle).internal.
  super___shared_ptr<duckdb::CSVBufferHandle,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->lines_read = 0;
  this->bytes_read = 0;
  pos = shared_ptr<duckdb::CSVBufferManager,_true>::operator->(&this->buffer_manager);
  CSVBufferManager::GetBuffer((CSVBufferManager *)&stack0xffffffffffffffd8,(idx_t)pos);
  pCVar6 = pCStack_20;
  _Var7._M_t.
  super__Tuple_impl<0UL,_duckdb::CSVFileHandle_*,_std::default_delete<duckdb::CSVFileHandle>_>.
  super__Head_base<0UL,_duckdb::CSVFileHandle_*,_false>._M_head_impl =
       (tuple<duckdb::CSVFileHandle_*,_std::default_delete<duckdb::CSVFileHandle>_>)
       (tuple<duckdb::CSVFileHandle_*,_std::default_delete<duckdb::CSVFileHandle>_>)
       local_28._M_head_impl;
  local_28._M_head_impl = (CSVFileHandle *)0x0;
  pCStack_20 = (ClientContext *)0x0;
  (this->cur_buffer_handle).internal.
  super___shared_ptr<duckdb::CSVBufferHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       _Var7._M_t.
       super__Tuple_impl<0UL,_duckdb::CSVFileHandle_*,_std::default_delete<duckdb::CSVFileHandle>_>.
       super__Head_base<0UL,_duckdb::CSVFileHandle_*,_false>._M_head_impl;
  p_Var1 = (this->cur_buffer_handle).internal.
           super___shared_ptr<duckdb::CSVBufferHandle,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
  ;
  (this->cur_buffer_handle).internal.
  super___shared_ptr<duckdb::CSVBufferHandle,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pCVar6;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
    if (pCStack_20 != (ClientContext *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pCStack_20);
    }
    _Var7._M_t.
    super__Tuple_impl<0UL,_duckdb::CSVFileHandle_*,_std::default_delete<duckdb::CSVFileHandle>_>.
    super__Head_base<0UL,_duckdb::CSVFileHandle_*,_false>._M_head_impl =
         (tuple<duckdb::CSVFileHandle_*,_std::default_delete<duckdb::CSVFileHandle>_>)
         (this->cur_buffer_handle).internal.
         super___shared_ptr<duckdb::CSVBufferHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  }
  if ((_Tuple_impl<0UL,_duckdb::CSVFileHandle_*,_std::default_delete<duckdb::CSVFileHandle>_>)
      _Var7._M_t.
      super__Tuple_impl<0UL,_duckdb::CSVFileHandle_*,_std::default_delete<duckdb::CSVFileHandle>_>.
      super__Head_base<0UL,_duckdb::CSVFileHandle_*,_false>._M_head_impl == (CSVFileHandle *)0x0) {
    pdVar9 = (data_ptr_t)0x0;
  }
  else {
    pCVar8 = shared_ptr<duckdb::CSVBufferHandle,_true>::operator->(&this->cur_buffer_handle);
    this_00 = &(pCVar8->handle).node;
    optional_ptr<duckdb::FileBuffer,_true>::CheckValid(this_00);
    pdVar9 = this_00->ptr->buffer;
  }
  this->buffer_handle_ptr = (char *)pdVar9;
  return;
}

Assistant:

BaseScanner::BaseScanner(shared_ptr<CSVBufferManager> buffer_manager_p, shared_ptr<CSVStateMachine> state_machine_p,
                         shared_ptr<CSVErrorHandler> error_handler_p, bool sniffing_p,
                         shared_ptr<CSVFileScan> csv_file_scan_p, const CSVIterator &iterator_p)
    : csv_file_scan(std::move(csv_file_scan_p)), sniffing(sniffing_p), error_handler(std::move(error_handler_p)),
      state_machine(std::move(state_machine_p)), states(), buffer_manager(std::move(buffer_manager_p)),
      iterator(iterator_p) {
	D_ASSERT(buffer_manager);
	D_ASSERT(state_machine);
	// Initialize current buffer handle
	cur_buffer_handle = buffer_manager->GetBuffer(iterator.GetBufferIdx());
	if (!cur_buffer_handle) {
		buffer_handle_ptr = nullptr;
	} else {
		buffer_handle_ptr = cur_buffer_handle->Ptr();
	}
}